

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::Parser::ParseMethodOptions
          (Parser *this,LocationRecorder *parent_location,FileDescriptorProto *containing_file,
          int optionsFieldNumber,Message *mutable_options)

{
  bool bVar1;
  undefined1 local_90 [8];
  LocationRecorder location;
  ErrorMaker local_68;
  string_view local_58;
  string_view local_48;
  Message *local_38;
  Message *mutable_options_local;
  FileDescriptorProto *pFStack_28;
  int optionsFieldNumber_local;
  FileDescriptorProto *containing_file_local;
  LocationRecorder *parent_location_local;
  Parser *this_local;
  
  local_38 = mutable_options;
  mutable_options_local._4_4_ = optionsFieldNumber;
  pFStack_28 = containing_file;
  containing_file_local = (FileDescriptorProto *)parent_location;
  parent_location_local = (LocationRecorder *)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_48,"{");
  ConsumeEndOfDeclaration(this,local_48,(LocationRecorder *)containing_file_local);
  while( true ) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_58,"}");
    bVar1 = TryConsumeEndOfDeclaration(this,local_58,(LocationRecorder *)0x0);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return true;
    }
    bVar1 = AtEnd(this);
    if (bVar1) break;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&location.location_,";");
    bVar1 = TryConsumeEndOfDeclaration(this,stack0xffffffffffffff88,(LocationRecorder *)0x0);
    if (!bVar1) {
      LocationRecorder::LocationRecorder
                ((LocationRecorder *)local_90,(LocationRecorder *)containing_file_local,
                 mutable_options_local._4_4_);
      bVar1 = ParseOption(this,local_38,(LocationRecorder *)local_90,pFStack_28,OPTION_STATEMENT);
      if (!bVar1) {
        SkipStatement(this);
      }
      LocationRecorder::~LocationRecorder((LocationRecorder *)local_90);
    }
  }
  ErrorMaker::ErrorMaker(&local_68,"Reached end of input in method options (missing \'}\').");
  RecordError(this,local_68);
  return false;
}

Assistant:

bool Parser::ParseMethodOptions(const LocationRecorder& parent_location,
                                const FileDescriptorProto* containing_file,
                                const int optionsFieldNumber,
                                Message* mutable_options) {
  // Options!
  ConsumeEndOfDeclaration("{", &parent_location);
  while (!TryConsumeEndOfDeclaration("}", nullptr)) {
    if (AtEnd()) {
      RecordError("Reached end of input in method options (missing '}').");
      return false;
    }

    if (TryConsumeEndOfDeclaration(";", nullptr)) {
      // empty statement; ignore
    } else {
      LocationRecorder location(parent_location, optionsFieldNumber);
      if (!ParseOption(mutable_options, location, containing_file,
                       OPTION_STATEMENT)) {
        // This statement failed to parse.  Skip it, but keep looping to
        // parse other statements.
        SkipStatement();
      }
    }
  }

  return true;
}